

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateMessageHeader
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  FieldDescriptor **ppFVar5;
  FieldGenerator *pFVar6;
  Descriptor *pDVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  iterator iter;
  long lVar10;
  pointer ppOVar11;
  pointer ppEVar12;
  pointer ppMVar13;
  allocator_type local_e2;
  value_type local_e1;
  vector<char,_std::allocator<char>_> seen_oneofs;
  string message_comments;
  SourceLocation location;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) == '\x01') {
    for (ppMVar13 = (this->nested_message_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppMVar13 !=
        (this->nested_message_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppMVar13 = ppMVar13 + 1) {
      GenerateMessageHeader(*ppMVar13,printer);
    }
  }
  else {
    value = &this->class_name_;
    io::Printer::Print(printer,"#pragma mark - $classname$\n\n","classname",value);
    if (*(int *)(this->descriptor_ + 0x2c) != 0) {
      location._0_8_ = anon_unknown_7::SortFieldsByNumber(this->descriptor_);
      io::Printer::Print(printer,"typedef GPB_ENUM($classname$_FieldNumber) {\n","classname",value);
      io::Printer::Indent(printer);
      if (0 < *(int *)(this->descriptor_ + 0x2c)) {
        lVar9 = 0;
        do {
          ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)&location,
                               lVar9);
          pFVar6 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar5);
          FieldGenerator::GenerateFieldNumberConstant(pFVar6,printer);
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)(this->descriptor_ + 0x2c));
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"};\n\n");
      if (location._0_8_ != 0) {
        operator_delete__((void *)location._0_8_);
      }
    }
    for (ppOVar11 = (this->oneof_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppOVar11 !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppOVar11 = ppOVar11 + 1) {
      OneofGenerator::GenerateCaseEnum(*ppOVar11,printer);
    }
    message_comments._M_dataplus._M_p = (pointer)&message_comments.field_2;
    message_comments._M_string_length = 0;
    message_comments.field_2._M_local_buf[0] = '\0';
    location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
    location.leading_comments._M_string_length = 0;
    location.leading_comments.field_2._M_local_buf[0] = '\0';
    paVar8 = &location.trailing_comments.field_2;
    location.trailing_comments._M_string_length = 0;
    location.trailing_comments.field_2._M_local_buf[0] = '\0';
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    location.trailing_comments._M_dataplus._M_p = (pointer)paVar8;
    bVar3 = Descriptor::GetSourceLocation(this->descriptor_,&location);
    if (bVar3) {
      BuildCommentsString_abi_cxx11_
                ((string *)&seen_oneofs,(objectivec *)&location,(SourceLocation *)0x0,
                 SUB81(paVar8,0));
      std::__cxx11::string::operator=((string *)&message_comments,(string *)&seen_oneofs);
      if ((pointer *)
          seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (ulong)(seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1));
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&message_comments,0,(char *)message_comments._M_string_length,0x357dff);
    }
    io::Printer::Print(printer,
                       "$comments$$deprecated_attribute$@interface $classname$ : GPBMessage\n\n",
                       "classname",value,"deprecated_attribute",&this->deprecated_attribute_,
                       "comments",&message_comments);
    local_e1 = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              (&seen_oneofs,(long)*(int *)(this->descriptor_ + 0x38),&local_e1,&local_e2);
    pDVar7 = this->descriptor_;
    if (0 < *(int *)(pDVar7 + 0x2c)) {
      lVar9 = 0;
      lVar10 = 0;
      do {
        lVar1 = *(long *)(pDVar7 + 0x30);
        lVar2 = *(long *)(lVar1 + 0x60 + lVar9);
        if (lVar2 != 0) {
          iVar4 = (int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x40)) >> 4) *
                  -0x55555555;
          if (seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4] == '\0') {
            seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = '\x01';
            OneofGenerator::GeneratePublicCasePropertyDeclaration
                      ((this->oneof_generators_).
                       super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar4],printer);
          }
        }
        pFVar6 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)(lVar1 + lVar9))
        ;
        (*pFVar6->_vptr_FieldGenerator[3])(pFVar6,printer);
        lVar10 = lVar10 + 1;
        pDVar7 = this->descriptor_;
        lVar9 = lVar9 + 0xa8;
      } while (lVar10 < *(int *)(pDVar7 + 0x2c));
    }
    io::Printer::Print(printer,"@end\n\n");
    pDVar7 = this->descriptor_;
    if (0 < *(int *)(pDVar7 + 0x2c)) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        pFVar6 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar7 + 0x30) + lVar10));
        (*pFVar6->_vptr_FieldGenerator[5])(pFVar6,printer);
        lVar9 = lVar9 + 1;
        pDVar7 = this->descriptor_;
        lVar10 = lVar10 + 0xa8;
      } while (lVar9 < *(int *)(pDVar7 + 0x2c));
    }
    ppOVar11 = (this->oneof_generators_).
               super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppOVar11 !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (; ppOVar11 !=
             (this->oneof_generators_).
             super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
             ._M_impl.super__Vector_impl_data._M_finish; ppOVar11 = ppOVar11 + 1) {
        OneofGenerator::GenerateClearFunctionDeclaration(*ppOVar11,printer);
      }
      io::Printer::Print(printer,"\n");
    }
    if (0 < *(int *)(this->descriptor_ + 0x78)) {
      io::Printer::Print(printer,"@interface $classname$ (DynamicMethods)\n\n","classname",value);
      for (ppEVar12 = (this->extension_generators_).
                      super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppEVar12 !=
          (this->extension_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppEVar12 = ppEVar12 + 1) {
        ExtensionGenerator::GenerateMembersHeader(*ppEVar12,printer);
      }
      io::Printer::Print(printer,"@end\n\n");
    }
    for (ppMVar13 = (this->nested_message_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppMVar13 !=
        (this->nested_message_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppMVar13 = ppMVar13 + 1) {
      GenerateMessageHeader(*ppMVar13,printer);
    }
    if (seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&location.leading_detached_comments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)location.trailing_comments._M_dataplus._M_p != &location.trailing_comments.field_2) {
      operator_delete(location.trailing_comments._M_dataplus._M_p,
                      CONCAT71(location.trailing_comments.field_2._M_allocated_capacity._1_7_,
                               location.trailing_comments.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)location.leading_comments._M_dataplus._M_p != &location.leading_comments.field_2) {
      operator_delete(location.leading_comments._M_dataplus._M_p,
                      CONCAT71(location.leading_comments.field_2._M_allocated_capacity._1_7_,
                               location.leading_comments.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_comments._M_dataplus._M_p != &message_comments.field_2) {
      operator_delete(message_comments._M_dataplus._M_p,
                      CONCAT71(message_comments.field_2._M_allocated_capacity._1_7_,
                               message_comments.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateMessageHeader(io::Printer* printer) {
  // This a a map entry message, just recurse and do nothing directly.
  if (IsMapEntryMessage(descriptor_)) {
    for (vector<MessageGenerator*>::iterator iter =
             nested_message_generators_.begin();
         iter != nested_message_generators_.end(); ++iter) {
      (*iter)->GenerateMessageHeader(printer);
    }
    return;
  }

  printer->Print(
      "#pragma mark - $classname$\n"
      "\n",
      "classname", class_name_);

  if (descriptor_->field_count()) {
    scoped_array<const FieldDescriptor*> sorted_fields(
        SortFieldsByNumber(descriptor_));

    printer->Print("typedef GPB_ENUM($classname$_FieldNumber) {\n",
                   "classname", class_name_);
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(sorted_fields[i])
          .GenerateFieldNumberConstant(printer);
    }

    printer->Outdent();
    printer->Print("};\n\n");
  }

  for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
       iter != oneof_generators_.end(); ++iter) {
    (*iter)->GenerateCaseEnum(printer);
  }

  string message_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    message_comments = BuildCommentsString(location, false);
  } else {
    message_comments = "";
  }

  printer->Print(
      "$comments$$deprecated_attribute$@interface $classname$ : GPBMessage\n\n",
      "classname", class_name_,
      "deprecated_attribute", deprecated_attribute_,
      "comments", message_comments);

  vector<char> seen_oneofs(descriptor_->oneof_decl_count(), 0);
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() != NULL) {
      const int oneof_index = field->containing_oneof()->index();
      if (!seen_oneofs[oneof_index]) {
        seen_oneofs[oneof_index] = 1;
        oneof_generators_[oneof_index]->GeneratePublicCasePropertyDeclaration(
            printer);
      }
    }
    field_generators_.get(field).GeneratePropertyDeclaration(printer);
  }

  printer->Print("@end\n\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateCFunctionDeclarations(printer);
  }

  if (!oneof_generators_.empty()) {
    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GenerateClearFunctionDeclaration(printer);
    }
    printer->Print("\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print("@interface $classname$ (DynamicMethods)\n\n",
                   "classname", class_name_);
    for (vector<ExtensionGenerator*>::iterator iter =
             extension_generators_.begin();
         iter != extension_generators_.end(); ++iter) {
      (*iter)->GenerateMembersHeader(printer);
    }
    printer->Print("@end\n\n");
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateMessageHeader(printer);
  }
}